

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void build_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
               int **_AdjB,int *AdjP)

{
  pointer ppVar1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var2;
  iterator iVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var10;
  pair<int,_int> *e;
  pointer __args;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges_alter;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_58;
  iterator iStack_50;
  pair<int,_int> *local_48;
  pair<int,_int> local_38;
  
  local_58._M_current = (pair<int,_int> *)0x0;
  iStack_50._M_current = (pair<int,_int> *)0x0;
  local_48 = (pair<int,_int> *)0x0;
  __args = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != ppVar1) {
    do {
      if (iStack_50._M_current == local_48) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   iStack_50,__args);
      }
      else {
        *iStack_50._M_current = *__args;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_38.second = __args->first;
      local_38.first = __args->second;
      if (iStack_50._M_current == local_48) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                   iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != ppVar1);
  }
  iVar3._M_current = iStack_50._M_current;
  _Var2._M_current = local_58._M_current;
  if (local_58._M_current != iStack_50._M_current) {
    uVar4 = (long)iStack_50._M_current - (long)local_58._M_current >> 3;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
              (local_58,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         )iStack_50._M_current,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
               0x114fbc);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
              (_Var2,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      )iVar3._M_current,
               (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
               0x114fbc);
  }
  iVar3._M_current = iStack_50._M_current;
  _Var2._M_current = local_58._M_current;
  lVar5 = ((long)iStack_50._M_current - (long)local_58._M_current) * 0x20000000;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 >> 0x1e;
  }
  piVar6 = (int *)operator_new__(uVar4);
  lVar5 = 0xffffffff;
  iVar8 = -1;
  lVar7 = 0;
  for (_Var10._M_current = _Var2._M_current; _Var10._M_current != iVar3._M_current;
      _Var10._M_current = _Var10._M_current + 1) {
    iVar8 = (int)lVar5;
    if (((_Var10._M_current)->first != iVar8) && (iVar8 < (_Var10._M_current)->first)) {
      lVar5 = (long)iVar8;
      do {
        AdjP[lVar5 + 1] = (int)lVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 < (_Var10._M_current)->first);
    }
    iVar8 = (int)lVar5;
    piVar6[lVar7] = (_Var10._M_current)->second;
    lVar7 = lVar7 + 1;
  }
  lVar5 = (long)size;
  if (iVar8 < size) {
    lVar9 = (long)iVar8;
    do {
      AdjP[lVar9 + 1] = (int)lVar7;
      lVar9 = lVar9 + 1;
    } while (lVar5 != lVar9);
  }
  *_AdjB = piVar6;
  if (_Var2._M_current != (pair<int,_int> *)0x0) {
    operator_delete(_Var2._M_current);
  }
  return;
}

Assistant:

void build_adjacent_table(const vector<pair<int, int> > &edges, int **_AdjB, int *AdjP) {
    vector<pair<int, int> > edges_alter;
    for (auto &e : edges) {
        edges_alter.push_back(e);
        edges_alter.push_back(make_pair(e.second, e.first));
    }
    sort(edges_alter.begin(), edges_alter.end(), cmp_edges);
    int size_edge = edges_alter.size();
    int *AdjB = new int[size_edge];
    int curP = 0, curV = -1;
    for (auto &e: edges_alter) {
        if (e.first != curV) {
            //curV = e.first;
            for (curV += 1; curV <= e.first; ++curV)
                AdjP[curV] = curP;
            --curV;
        }
        AdjB[curP++] = e.second;
    }
    for (curV += 1; curV <= size; ++curV)
        AdjP[curV] = curP;
    
    *_AdjB = AdjB;
}